

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Impl::Impl(Impl *this,AnnotationFlag annotationFlag)

{
  Workspace *this_00;
  _Rb_tree_header *p_Var1;
  Disposer *pDVar2;
  Node *pNVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  StructSchema SVar6;
  int *piVar7;
  mapped_type *ppNVar8;
  mapped_type *pmVar9;
  ListElementCount LVar10;
  ElementCount index;
  CapTableReader *pCVar11;
  ElementCount index_00;
  SegmentReader *pSVar12;
  bool bVar13;
  Orphanage OVar14;
  Reader RVar15;
  Reader params;
  Which which;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> newNode;
  StringPtr symbolName;
  Field field;
  StructSchema declSchema;
  PointerReader local_1e8;
  undefined6 uStack_1c8;
  ElementSize EStack_1c2;
  undefined1 uStack_1c1;
  int iStack_1c0;
  undefined4 uStack_1bc;
  StructReader local_1b8;
  PointerReader local_188;
  Workspace *local_168;
  void *local_160;
  ListReader local_158;
  key_type local_120;
  RawBrandedSchema *local_110;
  ElementCount local_108;
  StructReader local_100;
  StructSchema local_d0;
  StructReader local_c8;
  ListReader local_98;
  FieldList local_68;
  
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_0020e7e8;
  this->annotationFlag = annotationFlag;
  kj::Arena::Arena(&this->nodeArena,0x400);
  (this->modules)._M_h._M_buckets = &(this->modules)._M_h._M_single_bucket;
  (this->modules)._M_h._M_bucket_count = 1;
  (this->modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modules)._M_h._M_element_count = 0;
  (this->modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->workspace;
  MallocMessageBuilder::MallocMessageBuilder(&this_00->message,0x400,GROW_HEURISTICALLY);
  OVar14 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  (this->workspace).orphanage = OVar14;
  kj::Arena::Arena(&(this->workspace).arena,0x400);
  SchemaLoader::SchemaLoader(&(this->workspace).bootstrapLoader,&this->super_LazyLoadCallback);
  (this->nodesById)._M_h._M_buckets = &(this->nodesById)._M_h._M_single_bucket;
  (this->nodesById)._M_h._M_bucket_count = 1;
  (this->nodesById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodesById)._M_h._M_element_count = 0;
  (this->nodesById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodesById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodesById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sourceInfoById)._M_h._M_buckets = &(this->sourceInfoById)._M_h._M_single_bucket;
  (this->sourceInfoById)._M_h._M_bucket_count = 1;
  (this->sourceInfoById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sourceInfoById)._M_h._M_element_count = 0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sourceInfoById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->builtinDecls)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nextBogusId = 1000;
  local_d0.super_Schema.raw = (Schema)((long)schemas::s_96efe787c17e83bb + 0x48);
  local_168 = this_00;
  StructSchema::getFields(&local_68,&local_d0);
  if (local_68.list.reader.elementCount != 0) {
    index_00 = 0;
    do {
      SVar6.super_Schema.raw = (Schema)(Schema)local_68.parent;
      capnp::_::ListReader::getStructElement(&local_100,&local_68.list.reader,index_00);
      LVar10 = local_100.nestingLimit;
      SVar5 = local_100.pointerCount;
      pWVar4 = local_100.pointers;
      pCVar11 = local_100.capTable;
      pSVar12 = local_100.segment;
      local_110 = (RawBrandedSchema *)SVar6.super_Schema.raw;
      local_108 = index_00;
      if ((0x1f < local_100.dataSize) &&
         (local_160 = local_100.data, *(short *)((long)local_100.data + 2) != 0)) {
        local_1e8.capTable = local_100.capTable;
        local_1e8.pointer = local_100.pointers;
        local_1e8.segment = local_100.segment;
        local_1e8.nestingLimit = local_100.nestingLimit;
        if (local_100.pointerCount == 0) {
          local_1e8.capTable = (CapTableReader *)0x0;
          local_1e8.pointer = (WirePointer *)0x0;
          local_1e8.segment = (SegmentReader *)0x0;
          local_1e8.nestingLimit = 0x7fffffff;
        }
        RVar15 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1e8,(void *)0x0,0);
        piVar7 = RVar15.super_StringPtr.content.ptr;
        if ((6 < RVar15.super_StringPtr.content.size_ - 1) &&
           (*(int *)((long)piVar7 + 3) == 0x6e69746c && *piVar7 == 0x6c697562)) {
          local_120.content.ptr = (char *)((long)piVar7 + 7);
          local_120.content.size_ = RVar15.super_StringPtr.content.size_ - 7;
          local_1e8.pointer = (WirePointer *)0x0;
          local_1e8.nestingLimit = 0;
          local_1e8._28_2_ = 0;
          local_1e8.segment = (SegmentReader *)0x0;
          local_1e8.capTable = (CapTableReader *)0x0;
          local_1e8._30_2_ = 0;
          uStack_1c8 = 0;
          EStack_1c2 = INLINE_COMPOSITE;
          iStack_1c0 = 0x7fffffff;
          if (SVar5 < 2) {
            LVar10 = 0x7fffffff;
            pCVar11 = (CapTableReader *)0x0;
            local_1b8.data = (WirePointer *)0x0;
            pSVar12 = (SegmentReader *)0x0;
          }
          else {
            local_1b8.data = pWVar4 + 1;
          }
          local_1b8.segment = pSVar12;
          local_1b8.capTable = pCVar11;
          local_1b8.pointers._0_4_ = LVar10;
          capnp::_::PointerReader::getList
                    (&local_158,(PointerReader *)&local_1b8,INLINE_COMPOSITE,(word *)0x0);
          LVar10 = local_158.elementCount;
          if (local_158.elementCount != 0) {
            index = 0;
            do {
              capnp::_::ListReader::getStructElement(&local_1b8,&local_158,index);
              if ((0x3f < local_1b8.dataSize) &&
                 (*local_1b8.data == (WirePointer)0x94099c3f9eb32d6b)) {
                bVar13 = local_1b8.pointerCount == 0;
                local_188.pointer =
                     (WirePointer *)
                     CONCAT44(local_1b8.pointers._4_4_,(ListElementCount)local_1b8.pointers);
                if (bVar13) {
                  local_188.pointer = (WirePointer *)0x0;
                }
                local_188.nestingLimit = local_1b8.nestingLimit;
                if (bVar13) {
                  local_188.nestingLimit = 0x7fffffff;
                }
                local_188.segment._0_4_ = 0;
                local_188.segment._4_4_ = 0;
                local_188.capTable._0_4_ = 0;
                local_188.capTable._4_4_ = 0;
                if (!bVar13) {
                  local_188.segment._0_4_ = local_1b8.segment._0_4_;
                  local_188.segment._4_4_ = local_1b8.segment._4_4_;
                  local_188.capTable._0_4_ = local_1b8.capTable._0_4_;
                  local_188.capTable._4_4_ = local_1b8.capTable._4_4_;
                }
                capnp::_::PointerReader::getStruct(&local_c8,&local_188,(word *)0x0);
                local_188.nestingLimit = local_c8.nestingLimit;
                local_188.pointer = local_c8.pointers;
                if (local_c8.pointerCount == 0) {
                  local_188.pointer = (WirePointer *)0x0;
                  local_188.nestingLimit = 0x7fffffff;
                }
                local_188.segment._0_4_ = 0;
                local_188.segment._4_4_ = 0;
                local_188.capTable._0_4_ = 0;
                local_188.capTable._4_4_ = 0;
                if (local_c8.pointerCount != 0) {
                  local_188.segment._0_4_ = local_c8.segment._0_4_;
                  local_188.segment._4_4_ = local_c8.segment._4_4_;
                  local_188.capTable._0_4_ = local_c8.capTable._0_4_;
                  local_188.capTable._4_4_ = local_c8.capTable._4_4_;
                }
                capnp::_::PointerReader::getList(&local_98,&local_188,INLINE_COMPOSITE,(word *)0x0);
                local_1e8.segment = local_98.segment;
                local_1e8.capTable = local_98.capTable;
                local_1e8.pointer = (WirePointer *)local_98.ptr;
                local_1e8.nestingLimit = local_98.elementCount;
                local_1e8._28_2_ = local_98.step._0_2_;
                local_1e8._30_2_ = local_98.step._2_2_;
                uStack_1c8 = local_98._32_6_;
                EStack_1c2 = local_98.elementSize;
                uStack_1c1 = local_98._39_1_;
                iStack_1c0 = local_98.nestingLimit;
                uStack_1bc = local_98._44_4_;
                break;
              }
              index = index + 1;
            } while (LVar10 != index);
          }
          local_1b8.segment =
               (SegmentReader *)CONCAT62(local_1b8.segment._2_6_,~*(ushort *)((long)local_160 + 2));
          kj::Arena::
          allocateOwn<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                    ((Arena *)&local_158,(StringPtr *)&this->nodeArena,(Which *)&local_120,
                     (Reader *)&local_1b8);
          pCVar11 = local_158.capTable;
          ppNVar8 = std::
                    map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                    ::operator[](&this->builtinDeclsByKind,(key_type *)&local_1b8);
          *ppNVar8 = (mapped_type)pCVar11;
          pmVar9 = std::
                   map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                   ::operator[](&this->builtinDecls,&local_120);
          pDVar2 = pmVar9->disposer;
          pNVar3 = pmVar9->ptr;
          *(undefined4 *)&pmVar9->disposer = local_158.segment._0_4_;
          *(undefined4 *)((long)&pmVar9->disposer + 4) = local_158.segment._4_4_;
          *(undefined4 *)&pmVar9->ptr = local_158.capTable._0_4_;
          *(undefined4 *)((long)&pmVar9->ptr + 4) = local_158.capTable._4_4_;
          local_158.capTable = (CapTableReader *)0x0;
          if ((pNVar3 != (Node *)0x0) &&
             ((**pDVar2->_vptr_Disposer)
                        (pDVar2,(_func_int *)
                                ((long)&(pNVar3->super_Resolver)._vptr_Resolver +
                                (long)(pNVar3->super_Resolver)._vptr_Resolver[-2])),
             pCVar11 = local_158.capTable, (mapped_type)local_158.capTable != (mapped_type)0x0)) {
            local_158.capTable = (CapTableReader *)0x0;
            (*(code *)**(undefined8 **)CONCAT44(local_158.segment._4_4_,local_158.segment._0_4_))
                      ((undefined8 *)CONCAT44(local_158.segment._4_4_,local_158.segment._0_4_),
                       (_func_int *)
                       ((long)&((Resolver *)&pCVar11->_vptr_CapTableReader)->_vptr_Resolver +
                       (long)((Resolver *)&pCVar11->_vptr_CapTableReader)->_vptr_Resolver[-2]));
          }
        }
      }
      index_00 = index_00 + 1;
    } while (index_00 != local_68.list.reader.elementCount);
  }
  return;
}

Assistant:

Compiler::Impl::Impl(AnnotationFlag annotationFlag)
    : annotationFlag(annotationFlag), workspace(*this) {
  // Reflectively interpret the members of Declaration.body.  Any member prefixed by "builtin"
  // defines a builtin declaration visible in the global scope.

  StructSchema declSchema = Schema::from<Declaration>();
  for (auto field: declSchema.getFields()) {
    auto fieldProto = field.getProto();
    if (fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT) {
      auto name = fieldProto.getName();
      if (name.startsWith("builtin")) {
        kj::StringPtr symbolName = name.slice(strlen("builtin"));

        List<Declaration::BrandParameter>::Reader params;
        for (auto annotation: fieldProto.getAnnotations()) {
          if (annotation.getId() == 0x94099c3f9eb32d6bull) {
            params = annotation.getValue().getList().getAs<List<Declaration::BrandParameter>>();
            break;
          }
        }

        Declaration::Which which =
            static_cast<Declaration::Which>(fieldProto.getDiscriminantValue());
        kj::Own<Node> newNode = nodeArena.allocateOwn<Node>(symbolName, which, params);
        builtinDeclsByKind[which] = newNode;
        builtinDecls[symbolName] = kj::mv(newNode);
      }
    }
  }
}